

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O1

CatalogEntryLookup * __thiscall
duckdb::Catalog::LookupEntry
          (CatalogEntryLookup *__return_storage_ptr__,Catalog *this,CatalogEntryRetriever *retriever
          ,string *schema,EntryLookupInfo *lookup_info,OnEntryNotFound if_not_found)

{
  string local_38;
  
  TryLookupEntry(__return_storage_ptr__,this,retriever,schema,lookup_info,if_not_found);
  if ((__return_storage_ptr__->error).initialized != true) {
    return __return_storage_ptr__;
  }
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,anon_var_dwarf_4f001a4 + 9);
  ErrorData::Throw(&__return_storage_ptr__->error,&local_38);
}

Assistant:

CatalogEntryLookup Catalog::LookupEntry(CatalogEntryRetriever &retriever, const string &schema,
                                        const EntryLookupInfo &lookup_info, OnEntryNotFound if_not_found) {
	auto res = TryLookupEntry(retriever, schema, lookup_info, if_not_found);

	if (res.error.HasError()) {
		res.error.Throw();
	}

	return res;
}